

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O0

string * __thiscall
deqp::RobustBufferAccessBehavior::TexelFetchTest::getFragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,TexelFetchTest *this,bool is_case_valid)

{
  GLchar *__s;
  allocator<char> local_4a;
  undefined1 local_49;
  size_t local_48;
  size_t position;
  GLchar *type;
  GLchar *sampler;
  GLchar *point;
  GLchar *plane;
  TexelFetchTest *pTStack_18;
  bool is_case_valid_local;
  TexelFetchTest *this_local;
  string *source;
  
  __s = getFragmentShader::template_code;
  point = getFragmentShader::plane_0;
  sampler = getFragmentShader::point_valid;
  type = getFragmentShader::sampler_regular;
  position = (size_t)getFragmentShader::type_vec4;
  if (((this->m_test_case == R8) || (this->m_test_case == RG8_SNORM)) ||
     (this->m_test_case == RGBA32F)) {
    if (!is_case_valid) {
      sampler = getFragmentShader::point_invalid;
    }
  }
  else if (this->m_test_case == R32UI_MIPMAP) {
    point = getFragmentShader::plane_1;
    type = getFragmentShader::sampler_regular_u;
    position = (size_t)getFragmentShader::type_uvec4;
    if (!is_case_valid) {
      point = getFragmentShader::plane_2;
    }
  }
  else if (this->m_test_case == R32UI_MULTISAMPLE) {
    point = getFragmentShader::plane_sample_valid;
    type = getFragmentShader::sampler_multisampled_u;
    position = (size_t)getFragmentShader::type_uvec4;
    if (!is_case_valid) {
      point = getFragmentShader::plane_sample_invalid;
    }
  }
  local_48 = 0;
  local_49 = 0;
  plane._7_1_ = is_case_valid;
  pTStack_18 = this;
  this_local = (TexelFetchTest *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_4a)
  ;
  std::allocator<char>::~allocator(&local_4a);
  replaceToken("TYPE",&local_48,(GLchar *)position,__return_storage_ptr__);
  replaceToken("SAMPLER",&local_48,type,__return_storage_ptr__);
  replaceToken("PLANE",&local_48,point,__return_storage_ptr__);
  replaceToken("POINT",&local_48,sampler,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string TexelFetchTest::getFragmentShader(bool is_case_valid)
{
	static const GLchar* plane_0 = "    int   plane  = 0;\n";

	static const GLchar* plane_1 = "    int   plane  = 1;\n";

	static const GLchar* plane_2 = "    int   plane  = 2;\n";

	static const GLchar* plane_sample_invalid = "    int   plane  = 9;\n";
	//"    int   plane  = gl_SampleID + 4;\n";

	static const GLchar* plane_sample_valid = "    int   plane  = gl_SampleID;\n";

	static const GLchar* point_invalid = "    ivec2 point  = ivec2(gs_fs_tex_coord * 16.0) + ivec2(16, 16);\n";

	static const GLchar* point_valid = "    ivec2 point  = ivec2(gs_fs_tex_coord * 16.0);\n";

	static const GLchar* sampler_regular		= "sampler2D";
	static const GLchar* sampler_regular_u		= "usampler2D";
	static const GLchar* sampler_multisampled_u = "usampler2DMS";

	static const GLchar* template_code = "#version 430 core\n"
										 "\n"
										 "                      in      vec2      gs_fs_tex_coord;\n"
										 "layout (location = 0) out     TYPE      out_fs_color;\n"
										 "layout (location = 0) uniform SAMPLER uni_texture;\n"
										 "\n"
										 "void main()\n"
										 "{\n"
										 "PLANE\n"
										 "POINT\n"
										 "    out_fs_color = texelFetch(uni_texture, point, plane);\n"
										 "}\n"
										 "\n";

	static const GLchar* type_vec4  = "vec4";
	static const GLchar* type_uvec4 = "uvec4";

	const GLchar* plane   = plane_0;
	const GLchar* point   = point_valid;
	const GLchar* sampler = sampler_regular;
	const GLchar* type	= type_vec4;

	if ((R8 == m_test_case) || (RG8_SNORM == m_test_case) || (RGBA32F == m_test_case))
	{
		if (false == is_case_valid)
		{
			point = point_invalid;
		}
	}
	else if (R32UI_MIPMAP == m_test_case)
	{
		plane   = plane_1;
		sampler = sampler_regular_u;
		type	= type_uvec4;

		if (false == is_case_valid)
		{
			plane = plane_2;
		}
	}
	else if (R32UI_MULTISAMPLE == m_test_case)
	{
		plane   = plane_sample_valid;
		sampler = sampler_multisampled_u;
		type	= type_uvec4;

		if (false == is_case_valid)
		{
			plane = plane_sample_invalid;
		}
	}

	size_t		position = 0;
	std::string source   = template_code;
	replaceToken("TYPE", position, type, source);
	replaceToken("SAMPLER", position, sampler, source);
	replaceToken("PLANE", position, plane, source);
	replaceToken("POINT", position, point, source);

	return source;
}